

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_column_writer.hpp
# Opt level: O2

void __thiscall
duckdb::StandardColumnWriter<duckdb::double_na_equal,_double,_duckdb::FloatingPointOperator>::
WriteVectorInternal<true>
          (StandardColumnWriter<duckdb::double_na_equal,_double,_duckdb::FloatingPointOperator>
           *this,WriteStream *temp_writer,ColumnWriterStatistics *stats,
          ColumnWriterPageState *page_state_p,Vector *input_column,idx_t chunk_start,idx_t chunk_end
          )

{
  TemplatedValidityMask<unsigned_long> *this_00;
  long lVar1;
  bool bVar2;
  uint32_t uVar3;
  Allocator *pAVar4;
  InternalException *this_01;
  idx_t r;
  double_na_equal *value;
  WriteStream *ser;
  allocator local_59;
  double target_value;
  StandardColumnWriter<duckdb::double_na_equal,_double,_duckdb::FloatingPointOperator> *local_38;
  
  ser = (WriteStream *)chunk_start;
  local_38 = this;
  FlatVector::VerifyFlatVector(input_column);
  if (9 < *(uint *)&page_state_p[1]._vptr_ColumnWriterPageState) {
switchD_002bb5be_caseD_1:
    this_01 = (InternalException *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string((string *)&target_value,"Unknown encoding",&local_59);
    duckdb::InternalException::InternalException(this_01,(string *)&target_value);
    __cxa_throw(this_01,&InternalException::typeinfo,std::runtime_error::~runtime_error);
  }
  this_00 = (TemplatedValidityMask<unsigned_long> *)(input_column + 0x28);
  lVar1 = *(long *)(input_column + 0x20);
  switch(*(uint *)&page_state_p[1]._vptr_ColumnWriterPageState) {
  case 0:
    if (*(long *)this_00 == 0) {
      TemplatedWritePlain<duckdb::double_na_equal,double,duckdb::FloatingPointOperator,true>
                (input_column,stats,chunk_start,chunk_end,(ValidityMask *)temp_writer,ser);
      return;
    }
    TemplatedWritePlain<duckdb::double_na_equal,double,duckdb::FloatingPointOperator,false>
              (input_column,stats,chunk_start,chunk_end,(ValidityMask *)this_00,temp_writer);
    return;
  default:
    goto switchD_002bb5be_caseD_1;
  case 5:
    if (*(char *)((long)&page_state_p[1]._vptr_ColumnWriterPageState + 4) == '\0') {
      for (; chunk_start < chunk_end; chunk_start = chunk_start + 1) {
        bVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid(this_00,chunk_start);
        if (bVar2) {
          target_value = *(double *)(lVar1 + chunk_start * 8);
          FloatingPointOperator::HandleStats<duckdb::double_na_equal,double>(stats,target_value);
          DbpEncoder::BeginWrite<double>((DbpEncoder *)(page_state_p + 2),temp_writer,&target_value)
          ;
          *(undefined1 *)((long)&page_state_p[1]._vptr_ColumnWriterPageState + 4) = 1;
          chunk_start = chunk_start + 1;
          break;
        }
      }
    }
    for (; chunk_start < chunk_end; chunk_start = chunk_start + 1) {
      target_value = *(double *)(lVar1 + chunk_start * 8);
      FloatingPointOperator::HandleStats<duckdb::double_na_equal,double>(stats,target_value);
      DbpEncoder::WriteValue<double>((DbpEncoder *)(page_state_p + 2),temp_writer,&target_value);
    }
    break;
  case 6:
    if (*(char *)&page_state_p[0x908]._vptr_ColumnWriterPageState == '\0') {
      for (; chunk_start < chunk_end; chunk_start = chunk_start + 1) {
        bVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid(this_00,chunk_start);
        if (bVar2) {
          target_value = *(double *)(lVar1 + chunk_start * 8);
          FloatingPointOperator::HandleStats<duckdb::double_na_equal,double>(stats,target_value);
          pAVar4 = (Allocator *)
                   duckdb::BufferAllocator::Get
                             (((local_38->super_PrimitiveColumnWriter).super_ColumnWriter.writer)->
                              context);
          DlbaEncoder::BeginWrite<double>
                    ((DlbaEncoder *)(page_state_p + 0x909),pAVar4,temp_writer,&target_value);
          *(undefined1 *)&page_state_p[0x908]._vptr_ColumnWriterPageState = 1;
          chunk_start = chunk_start + 1;
          break;
        }
      }
    }
    for (; chunk_start < chunk_end; chunk_start = chunk_start + 1) {
      target_value = *(double *)(lVar1 + chunk_start * 8);
      FloatingPointOperator::HandleStats<duckdb::double_na_equal,double>(stats,target_value);
      DlbaEncoder::WriteValue<double>
                ((DlbaEncoder *)(page_state_p + 0x909),temp_writer,&target_value);
    }
    break;
  case 8:
    if (*(char *)&page_state_p[0x121c]._vptr_ColumnWriterPageState == '\0') {
      for (; chunk_start < chunk_end; chunk_start = chunk_start + 1) {
        bVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid(this_00,chunk_start);
        if (bVar2) {
          target_value = (double)CONCAT71(target_value._1_7_,
                                          *(undefined1 *)
                                           ((long)&page_state_p[0x121c]._vptr_ColumnWriterPageState
                                           + 4));
          (*(code *)**(undefined8 **)temp_writer)(temp_writer,&target_value,1);
          page_state_p[0x121f]._vptr_ColumnWriterPageState = (_func_int **)0x0;
          page_state_p[0x1320]._vptr_ColumnWriterPageState = (_func_int **)0x0;
          *(undefined1 *)&page_state_p[0x121c]._vptr_ColumnWriterPageState = 1;
          break;
        }
      }
    }
    value = (double_na_equal *)(lVar1 + chunk_start * 8);
    for (; chunk_start < chunk_end; chunk_start = chunk_start + 1) {
      uVar3 = PrimitiveDictionary<duckdb::double_na_equal,_double,_duckdb::FloatingPointOperator>::
              GetIndex((PrimitiveDictionary<duckdb::double_na_equal,_double,_duckdb::FloatingPointOperator>
                        *)page_state_p[0x121b]._vptr_ColumnWriterPageState,value);
      target_value = (double)CONCAT44(target_value._4_4_,uVar3);
      RleBpEncoder::WriteValue
                ((RleBpEncoder *)(page_state_p + 0x121d),temp_writer,(uint32_t *)&target_value);
      value = value + 8;
    }
    break;
  case 9:
    if (*(char *)&page_state_p[0x1214]._vptr_ColumnWriterPageState == '\x01') {
      pAVar4 = (Allocator *)
               duckdb::BufferAllocator::Get
                         (((local_38->super_PrimitiveColumnWriter).super_ColumnWriter.writer)->
                          context);
      BssEncoder::BeginWrite((BssEncoder *)(page_state_p + 0x1215),pAVar4);
      *(undefined1 *)&page_state_p[0x1214]._vptr_ColumnWriterPageState = 1;
    }
    for (; chunk_start < chunk_end; chunk_start = chunk_start + 1) {
      target_value = *(double *)(lVar1 + chunk_start * 8);
      FloatingPointOperator::HandleStats<duckdb::double_na_equal,double>(stats,target_value);
      BssEncoder::WriteValue<double>((BssEncoder *)(page_state_p + 0x1215),&target_value);
    }
  }
  return;
}

Assistant:

void WriteVectorInternal(WriteStream &temp_writer, ColumnWriterStatistics *stats,
	                         ColumnWriterPageState *page_state_p, Vector &input_column, idx_t chunk_start,
	                         idx_t chunk_end) {
		auto &page_state = page_state_p->Cast<StandardWriterPageState<SRC, TGT, OP>>();

		const auto &mask = FlatVector::Validity(input_column);
		const auto *data_ptr = FlatVector::GetData<SRC>(input_column);

		switch (page_state.encoding) {
		case duckdb_parquet::Encoding::RLE_DICTIONARY: {
			idx_t r = chunk_start;
			if (!page_state.dict_written_value) {
				// find first non-null value
				for (; r < chunk_end; r++) {
					if (!mask.RowIsValid(r)) {
						continue;
					}
					// write the bit-width as a one-byte entry and initialize writer
					temp_writer.Write<uint8_t>(page_state.dict_bit_width);
					page_state.dict_encoder.BeginWrite();
					page_state.dict_written_value = true;
					break;
				}
			}

			for (; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const auto &src_value = data_ptr[r];
				const auto value_index = page_state.dictionary.GetIndex(src_value);
				page_state.dict_encoder.WriteValue(temp_writer, value_index);
			}
			break;
		}
		case duckdb_parquet::Encoding::DELTA_BINARY_PACKED: {
			idx_t r = chunk_start;
			if (!page_state.dbp_initialized) {
				// find first non-null value
				for (; r < chunk_end; r++) {
					if (!mask.RowIsValid(r)) {
						continue;
					}
					const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
					OP::template HandleStats<SRC, TGT>(stats, target_value);
					page_state.dbp_encoder.BeginWrite(temp_writer, target_value);
					page_state.dbp_initialized = true;
					r++; // skip over
					break;
				}
			}

			for (; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
				OP::template HandleStats<SRC, TGT>(stats, target_value);
				page_state.dbp_encoder.WriteValue(temp_writer, target_value);
			}
			break;
		}
		case duckdb_parquet::Encoding::DELTA_LENGTH_BYTE_ARRAY: {
			idx_t r = chunk_start;
			if (!page_state.dlba_initialized) {
				// find first non-null value
				for (; r < chunk_end; r++) {
					if (!mask.RowIsValid(r)) {
						continue;
					}
					const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
					OP::template HandleStats<SRC, TGT>(stats, target_value);
					page_state.dlba_encoder.BeginWrite(BufferAllocator::Get(writer.GetContext()), temp_writer,
					                                   target_value);
					page_state.dlba_initialized = true;
					r++; // skip over
					break;
				}
			}

			for (; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
				OP::template HandleStats<SRC, TGT>(stats, target_value);
				page_state.dlba_encoder.WriteValue(temp_writer, target_value);
			}
			break;
		}
		case duckdb_parquet::Encoding::BYTE_STREAM_SPLIT: {
			if (page_state.bss_initialized) {
				page_state.bss_encoder.BeginWrite(BufferAllocator::Get(writer.GetContext()));
				page_state.bss_initialized = true;
			}
			for (idx_t r = chunk_start; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
				OP::template HandleStats<SRC, TGT>(stats, target_value);
				page_state.bss_encoder.WriteValue(target_value);
			}
			break;
		}
		case duckdb_parquet::Encoding::PLAIN: {
			D_ASSERT(page_state.encoding == duckdb_parquet::Encoding::PLAIN);
			if (mask.AllValid()) {
				TemplatedWritePlain<SRC, TGT, OP, true>(input_column, stats, chunk_start, chunk_end, mask, temp_writer);
			} else {
				TemplatedWritePlain<SRC, TGT, OP, false>(input_column, stats, chunk_start, chunk_end, mask,
				                                         temp_writer);
			}
			break;
		}
		default:
			throw InternalException("Unknown encoding");
		}
	}